

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

void __thiscall
kj::StringTree::visit<kj::StringTree::flattenTo(char*)const::__0&>
          (StringTree *this,anon_class_8_1_6ca262cf *func)

{
  size_t sVar1;
  Branch *pBVar2;
  long lVar3;
  char *pcVar4;
  size_t sVar5;
  ulong uVar6;
  StringTree *this_00;
  ulong uVar7;
  
  sVar1 = (this->branches).size_;
  if (sVar1 == 0) {
    uVar6 = 0;
  }
  else {
    pBVar2 = (this->branches).ptr;
    lVar3 = sVar1 << 6;
    uVar6 = 0;
    do {
      this_00 = &pBVar2->content;
      sVar5 = *(ulong *)((long)(this_00 + -1) + 0x30) - uVar6;
      if (uVar6 <= *(ulong *)((long)(this_00 + -1) + 0x30) && sVar5 != 0) {
        pcVar4 = "";
        if ((this->text).content.size_ != 0) {
          pcVar4 = (this->text).content.ptr;
        }
        memcpy(*func->target,pcVar4 + uVar6,sVar5);
        *func->target = *func->target + sVar5;
        uVar6 = *(ulong *)((long)(this_00 + -1) + 0x30);
      }
      visit<kj::StringTree::flattenTo(char*)const::__0&>(this_00,func);
      pBVar2 = (Branch *)(this_00 + 1);
      lVar3 = lVar3 + -0x40;
    } while (lVar3 != 0);
  }
  sVar1 = (this->text).content.size_;
  uVar7 = 0;
  if (sVar1 != 0) {
    uVar7 = sVar1 - 1;
  }
  sVar5 = uVar7 - uVar6;
  if (uVar6 <= uVar7 && sVar5 != 0) {
    if (sVar1 == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (this->text).content.ptr;
    }
    memcpy(*func->target,pcVar4 + uVar6,sVar5);
    *func->target = *func->target + sVar5;
  }
  return;
}

Assistant:

void StringTree::visit(Func&& func) const {
  size_t pos = 0;
  for (auto& branch: branches) {
    if (branch.index > pos) {
      func(text.slice(pos, branch.index));
      pos = branch.index;
    }
    branch.content.visit(func);
  }
  if (text.size() > pos) {
    func(text.slice(pos, text.size()));
  }
}